

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_timidity_mididevice.cpp
# Opt level: O1

void __thiscall
TimidityWaveWriterMIDIDevice::~TimidityWaveWriterMIDIDevice(TimidityWaveWriterMIDIDevice *this)

{
  int iVar1;
  undefined8 in_RAX;
  long lVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  DWORD size;
  undefined8 uStack_18;
  
  (this->super_TimidityMIDIDevice).super_SoftSynthMIDIDevice.super_MIDIDevice._vptr_MIDIDevice =
       (_func_int **)&PTR__TimidityWaveWriterMIDIDevice_006f50b0;
  uStack_18 = in_RAX;
  if ((FILE *)this->File == (FILE *)0x0) goto LAB_0033f559;
  lVar2 = ftell((FILE *)this->File);
  uStack_18 = CONCAT44((int)lVar2 + -8,(undefined4)uStack_18);
  iVar1 = fseek((FILE *)this->File,4,0);
  if (iVar1 == 0) {
    sVar3 = fwrite((void *)((long)&uStack_18 + 4),4,1,(FILE *)this->File);
    if (sVar3 != 1) goto LAB_0033f533;
    uStack_18 = CONCAT44((int)lVar2 + -0x44,(undefined4)uStack_18);
    iVar1 = fseek((FILE *)this->File,0x38,1);
    if (iVar1 != 0) goto LAB_0033f533;
    sVar3 = fwrite((void *)((long)&uStack_18 + 4),4,1,(FILE *)this->File);
    if (sVar3 != 1) goto LAB_0033f533;
  }
  else {
LAB_0033f533:
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    Printf("Could not finish writing wave file: %s\n",pcVar5);
  }
  fclose((FILE *)this->File);
LAB_0033f559:
  TimidityMIDIDevice::~TimidityMIDIDevice(&this->super_TimidityMIDIDevice);
  return;
}

Assistant:

TimidityWaveWriterMIDIDevice::~TimidityWaveWriterMIDIDevice()
{
	if (File != NULL)
	{
		long pos = ftell(File);
		DWORD size;

		// data chunk size
		size = LittleLong(DWORD(pos - 8));
		if (0 == fseek(File, 4, SEEK_SET))
		{
			if (1 == fwrite(&size, 4, 1, File))
			{
				size = LittleLong(DWORD(pos - 12 - sizeof(FmtChunk) - 8));
				if (0 == fseek(File, 4 + sizeof(FmtChunk) + 4, SEEK_CUR))
				{
					if (1 == fwrite(&size, 4, 1, File))
					{
						fclose(File);
						return;
					}
				}
			}
		}
		Printf("Could not finish writing wave file: %s\n", strerror(errno));
		fclose(File);
	}
}